

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O2

int cmdline_read(CMDLINE_OPTION *options,int argc,char **argv,
                _func_int_int_char_ptr_void_ptr *callback,void *userdata)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  size_t __n;
  char *pcVar7;
  char cVar8;
  uint *puVar9;
  ulong __n_00;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  int i;
  long lVar14;
  char local_7f;
  byte local_7e;
  undefined1 local_7d;
  int local_7c;
  uint *local_78;
  char *local_70;
  long local_68;
  size_t local_60;
  char auxbuf [33];
  
  auxbuf[0x20] = '\0';
  local_7c = 1;
  for (puVar6 = &options->flags; puVar6[-1] != 0; puVar6 = puVar6 + 6) {
    if (((*puVar6 & 4) != 0) && (**(char **)(puVar6 + -3) != '-')) {
      local_7c = 0;
    }
  }
  local_78 = &options->flags;
  iVar13 = 1;
  bVar3 = false;
LAB_00104d3c:
  if (argc <= iVar13) {
    return 0;
  }
  pcVar12 = argv[iVar13];
  if (bVar3) {
LAB_00104d51:
    iVar4 = (*callback)(0,pcVar12,userdata);
    goto LAB_00104d60;
  }
  cVar8 = *pcVar12;
  if (cVar8 != '-') {
    if (local_7c != 0) {
      bVar3 = false;
      goto LAB_00104d51;
    }
LAB_00104daa:
    local_70 = pcVar12 + 2;
    local_68 = (long)iVar13;
    cVar10 = cVar8;
    for (puVar6 = local_78; uVar5 = puVar6[-1], uVar5 != 0; puVar6 = puVar6 + 6) {
      uVar2 = *puVar6;
      pcVar11 = *(char **)(puVar6 + -3);
      if ((uVar2 & 4) == 0) {
        if (((pcVar11 == (char *)0x0) || (cVar10 != '-')) || (pcVar12[1] != '-')) {
          if (((((CMDLINE_OPTION *)(puVar6 + -5))->shortname != 0) && (cVar10 = cVar8, cVar8 == '-')
              ) && (cVar10 = '-', pcVar12[1] == ((CMDLINE_OPTION *)(puVar6 + -5))->shortname)) {
            if ((uVar2 & 2) == 0) {
              iVar4 = (*callback)(uVar5,(char *)0x0,userdata);
              if (iVar4 != 0) goto LAB_00105047;
              pcVar12 = argv[local_68];
              iVar4 = 0;
              if (pcVar12[2] == '\0') goto LAB_00105047;
              lVar14 = 0;
              goto LAB_00104f15;
            }
            pcVar11 = local_70;
            if (pcVar12[2] == '\0') {
              if (iVar13 + 1 < argc) goto LAB_00104f88;
              uVar5 = 0x80000002;
              pcVar11 = pcVar12;
            }
            iVar4 = (*callback)(uVar5,pcVar11,userdata);
            goto LAB_00105047;
          }
        }
        else {
          local_60 = strlen(pcVar11);
          iVar4 = strncmp(local_70,pcVar11,local_60);
          cVar10 = '-';
          if (iVar4 == 0) {
            if (pcVar12[local_60 + 2] == '=') {
              if ((uVar2 & 3) == 0) {
                pcVar12 = auxbuf;
                snprintf(pcVar12,0x20,"--%s",pcVar11);
                uVar5 = 0x80000003;
              }
              else {
                pcVar12 = local_70 + local_60 + 1;
              }
            }
            else {
              if (pcVar12[local_60 + 2] != '\0') goto LAB_00104e60;
              if ((uVar2 & 2) == 0) {
                pcVar12 = (char *)0x0;
              }
              else {
                uVar5 = 0x80000002;
              }
            }
LAB_00104eba:
            iVar4 = (*callback)(uVar5,pcVar12,userdata);
            goto LAB_00105047;
          }
        }
      }
      else {
        __n = strlen(pcVar11);
        iVar4 = strncmp(pcVar12,pcVar11,__n);
        if (iVar4 == 0) {
          if (pcVar12[__n] != '\0') {
            pcVar12 = pcVar12 + __n;
            goto LAB_00104eba;
          }
          if (iVar13 + 1 < argc) {
LAB_00104f88:
            iVar13 = iVar13 + 1;
            iVar4 = (*callback)(uVar5,argv[iVar13],userdata);
          }
          else {
            iVar4 = (*callback)(-0x7ffffffe,pcVar11,userdata);
          }
          goto LAB_00105047;
        }
      }
LAB_00104e60:
    }
    goto LAB_00105069;
  }
  if (pcVar12[1] == '\0') goto LAB_00104d51;
  if ((pcVar12[1] != '-') || (pcVar12[2] != '\0')) goto LAB_00104daa;
  bVar3 = true;
  goto LAB_00104d69;
LAB_00104f15:
  do {
    bVar1 = pcVar12[lVar14 + 2];
    puVar9 = local_78;
    iVar4 = 0;
    if (bVar1 == 0) break;
    for (; puVar9[-1] != 0; puVar9 = puVar9 + 6) {
      if (bVar1 == ((CMDLINE_OPTION *)(puVar9 + -5))->shortname) {
        uVar5 = 0x80000002;
        if ((*puVar9 & 2) != 0) goto LAB_00104f4a;
        pcVar11 = (char *)0x0;
        uVar5 = puVar9[-1];
        goto LAB_00104f5f;
      }
    }
    uVar5 = 0x80000001;
LAB_00104f4a:
    local_7f = '-';
    local_7d = 0;
    pcVar11 = &local_7f;
    local_7e = bVar1;
LAB_00104f5f:
    iVar4 = (*callback)(uVar5,pcVar11,userdata);
    lVar14 = lVar14 + 1;
  } while (iVar4 == 0);
LAB_00105047:
  bVar3 = false;
  if (puVar6[-1] == 0) {
    pcVar12 = argv[iVar13];
    cVar8 = *pcVar12;
LAB_00105069:
    if (cVar8 == '-') {
      pcVar11 = pcVar12;
      if ((pcVar12[1] == '-') && (pcVar7 = strchr(pcVar12,0x3d), pcVar7 != (char *)0x0)) {
        __n_00 = (long)pcVar7 - (long)pcVar12;
        if (0x1f < (ulong)((long)pcVar7 - (long)pcVar12)) {
          __n_00 = 0x20;
        }
        pcVar11 = auxbuf;
        strncpy(pcVar11,pcVar12,__n_00);
        auxbuf[__n_00] = '\0';
      }
      iVar4 = (*callback)(-0x7fffffff,pcVar11,userdata);
    }
    else {
      iVar4 = (*callback)(0,pcVar12,userdata);
    }
    bVar3 = false;
  }
LAB_00104d60:
  if (iVar4 != 0) {
    return iVar4;
  }
LAB_00104d69:
  iVar13 = iVar13 + 1;
  goto LAB_00104d3c;
}

Assistant:

int
cmdline_read(const CMDLINE_OPTION* options, int argc, char** argv,
        int (*callback)(int /*optval*/, const char* /*arg*/, void* /*userdata*/),
        void* userdata)
{
    const CMDLINE_OPTION* opt;
    char auxbuf[CMDLINE_AUXBUF_SIZE+1];
    int fast_optarg_decision = 1;
    int after_doubledash = 0;
    int i = 1;
    int ret = 0;

    auxbuf[CMDLINE_AUXBUF_SIZE] = '\0';

    /* Check whether there is any CMDLINE_OPTFLAG_COMPILERLIKE option with
     * a name not starting with '-'. That would imply we can to check for
     * non-option arguments only after refusing all such options. */
    for(opt = options; opt->id != 0; opt++) {
        if((opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE)  &&  opt->longname[0] != '-')
            fast_optarg_decision = 0;
    }

    while(i < argc) {
        if(after_doubledash  ||  strcmp(argv[i], "-") == 0) {
            /* Non-option argument.
             * Standalone "-" usually means "read from stdin" or "write to
             * stdout" so treat it always as a non-option. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else if(strcmp(argv[i], "--") == 0) {
            /* End of options. All the remaining tokens are non-options
             * even if they start with a dash. */
            after_doubledash = 1;
        } else if(fast_optarg_decision  &&  argv[i][0] != '-') {
            /* Non-option argument. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else {
            for(opt = options; opt->id != 0; opt++) {
                if(opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i], opt->longname, len) == 0) {
                        /* Compiler-like option. */
                        if(argv[i][len] != '\0')
                            ret = callback(opt->id, argv[i] + len, userdata);
                        else if(i+1 < argc)
                            ret = callback(opt->id, argv[++i], userdata);
                        else
                            ret = callback(CMDLINE_OPTID_MISSINGARG, opt->longname, userdata);
                        break;
                    }
                } else if(opt->longname != NULL  &&  strncmp(argv[i], "--", 2) == 0) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i]+2, opt->longname, len) == 0) {
                        /* Regular long option. */
                        if(argv[i][2+len] == '\0') {
                            /* with no argument provided. */
                            if(!(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG))
                                ret = callback(opt->id, NULL, userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else if(argv[i][2+len] == '=') {
                            /* with an argument provided. */
                            if(opt->flags & (CMDLINE_OPTFLAG_OPTIONALARG | CMDLINE_OPTFLAG_REQUIREDARG)) {
                                ret = callback(opt->id, argv[i]+2+len+1, userdata);
                            } else {
                                snprintf(auxbuf, CMDLINE_AUXBUF_SIZE, "--%s", opt->longname);
                                ret = callback(CMDLINE_OPTID_BOGUSARG, auxbuf, userdata);
                            }
                            break;
                        } else {
                            continue;
                        }
                    }
                } else if(opt->shortname != '\0'  &&  argv[i][0] == '-') {
                    if(argv[i][1] == opt->shortname) {
                        /* Regular short option. */
                        if(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG) {
                            if(argv[i][2] != '\0')
                                ret = callback(opt->id, argv[i]+2, userdata);
                            else if(i+1 < argc)
                                ret = callback(opt->id, argv[++i], userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else {
                            ret = callback(opt->id, NULL, userdata);

                            /* There might be more (argument-less) short options
                             * grouped together. */
                            if(ret == 0  &&  argv[i][2] != '\0')
                                ret = cmdline_handle_short_opt_group(options, argv[i]+2, callback, userdata);
                            break;
                        }
                    }
                }
            }

            if(opt->id == 0) {  /* still not handled? */
                if(argv[i][0] != '-') {
                    /* Non-option argument. */
                    ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
                } else {
                    /* Unknown option. */
                    char* badoptname = argv[i];

                    if(strncmp(badoptname, "--", 2) == 0) {
                        /* Strip any argument from the long option. */
                        char* assignment = strchr(badoptname, '=');
                        if(assignment != NULL) {
                            size_t len = assignment - badoptname;
                            if(len > CMDLINE_AUXBUF_SIZE)
                                len = CMDLINE_AUXBUF_SIZE;
                            strncpy(auxbuf, badoptname, len);
                            auxbuf[len] = '\0';
                            badoptname = auxbuf;
                        }
                    }

                    ret = callback(CMDLINE_OPTID_UNKNOWN, badoptname, userdata);
                }
            }
        }

        if(ret != 0)
            return ret;
        i++;
    }

    return ret;
}